

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iwmmxt_helper.c
# Opt level: O3

uint64_t helper_iwmmxt_slll_arm(CPUARMState *env,uint64_t x,uint32_t n)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = x << ((byte)n & 0x3f);
  uVar2 = (x & 0xffffffff00000000) << ((byte)n & 0x3f);
  uVar1 = uVar3 & 0xffffffff;
  (env->iwmmxt).cregs[3] =
       (uint)(uVar2 == 0) << 0x1e | (uint)(0x7fffffff00000000 < uVar2) << 0x1f |
       (uint)(uVar1 == 0) << 0xe | (uint)uVar3 >> 0x10 & 0x8000;
  return uVar1 + uVar2;
}

Assistant:

uint64_t HELPER(iwmmxt_slll)(CPUARMState *env, uint64_t x, uint32_t n)
{
    x = ((x << n) & (0xffffffffll << 0)) |
        ((x & (0xffffffffll << 32)) << n);
    env->iwmmxt.cregs[ARM_IWMMXT_wCASF] =
        NZBIT32(x >> 0, 0) | NZBIT32(x >> 32, 1);
    return x;
}